

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBFunctionsInit(ClientContext *context,TableFunctionInitInput *input)

{
  bool bVar1;
  reference this;
  pointer this_00;
  iterator iVar2;
  pointer this_01;
  iterator iVar3;
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  in_RDI;
  DuckDBFunctionsData *in_stack_00000010;
  SchemaCatalogEntry *in_stack_00000018;
  ClientContext *in_stack_00000020;
  ClientContext *in_stack_00000028;
  reference_wrapper<duckdb::SchemaCatalogEntry> *schema;
  iterator __end1;
  iterator __begin1;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *__range1;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  templated_unique_single_t result;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
  local_58;
  undefined1 *local_50;
  undefined1 local_38 [56];
  
  make_uniq<duckdb::DuckDBFunctionsData>();
  Catalog::GetAllSchemas(in_stack_00000028);
  local_50 = local_38;
  local_58._M_current =
       (reference_wrapper<duckdb::SchemaCatalogEntry> *)
       ::std::
       vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
       ::begin((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                *)in_stack_ffffffffffffff48);
  ::std::
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
  ::end((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
         *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
           ::operator*(&local_58);
    ::std::reference_wrapper<duckdb::SchemaCatalogEntry>::get(this);
    unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
    ::operator*((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                 *)in_stack_ffffffffffffff50);
    ExtractFunctionsFromSchema(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>_>
    ::operator++(&local_58);
  }
  this_00 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
            ::operator->((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                          *)in_stack_ffffffffffffff50);
  iVar2 = ::std::
          vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
          ::begin(in_stack_ffffffffffffff48);
  this_01 = unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
            ::operator->((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
                          *)this_00);
  iVar3 = ::std::
          vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
          ::end((vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 *)this_01);
  ::std::
  sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,duckdb::DuckDBFunctionsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__0>
            (iVar2._M_current,iVar3._M_current);
  unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>,true>
  ::
  unique_ptr<duckdb::DuckDBFunctionsData,std::default_delete<std::unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>>>,void>
            ((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
              *)this_00,
             (unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>_>
              *)this_01);
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true>::~vector
            ((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *)0x140a795);
  unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DuckDBFunctionsData,_std::default_delete<duckdb::DuckDBFunctionsData>,_true>
               *)0x140a7a2);
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBFunctionsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBFunctionsData>();

	// scan all the schemas for tables and collect them and collect them
	auto schemas = Catalog::GetAllSchemas(context);
	for (auto &schema : schemas) {
		ExtractFunctionsFromSchema(context, schema.get(), *result);
	};

	std::sort(result->entries.begin(), result->entries.end(),
	          [&](reference<CatalogEntry> a, reference<CatalogEntry> b) {
		          return (int32_t)a.get().type < (int32_t)b.get().type;
	          });
	return std::move(result);
}